

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__jpeg_huff_decode(stbi__jpeg *j,stbi__huffman *h)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar2 = j->code_buffer;
  uVar4 = (ulong)h->fast[uVar2 >> 0x17];
  if (uVar4 == 0xff) {
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      lVar6 = lVar5 + 1;
    } while (h->maxcode[lVar5 + 10] <= uVar2 >> 0x10);
    iVar3 = j->code_bits;
    if (lVar6 == 8) {
      j->code_bits = iVar3 + -0x10;
    }
    else if ((int)(lVar5 + 10) <= iVar3) {
      iVar7 = (uVar2 >> (0x17U - (char)lVar6 & 0x1f) & stbi__bmask[lVar5 + 10]) +
              h->delta[lVar5 + 10];
      if ((uVar2 >> (-h->size[iVar7] & 0x1f) & stbi__bmask[h->size[iVar7]]) == (uint)h->code[iVar7])
      {
        j->code_bits = (iVar3 - (int)lVar6) + -9;
        j->code_buffer = uVar2 << ((byte)(lVar5 + 10) & 0x1f);
        return (uint)h->values[iVar7];
      }
      __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                    ,0x81a,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
    }
  }
  else {
    bVar1 = h->size[uVar4];
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar2 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
      return (uint)h->values[uVar4];
    }
  }
  return -1;
}

Assistant:

stbi_inline static int stbi__jpeg_huff_decode(stbi__jpeg *j, stbi__huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      int s = h->size[k];
      if (s > j->code_bits)
         return -1;
      j->code_buffer <<= s;
      j->code_bits -= s;
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   temp = j->code_buffer >> 16;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (32 - k)) & stbi__bmask[k]) + h->delta[k];
   STBI_ASSERT((((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   j->code_buffer <<= k;
   return h->values[c];
}